

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O2

size_t __thiscall
proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::ByteSizeLong(MyMessagePlusExtra *this)

{
  uint32_t uVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  
  sVar3 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_e_,1,
                     &(this->field_0)._impl_._repeated_e_cached_byte_size_);
  sVar4 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_packed_e_,1,
                     &(this->field_0)._impl_._repeated_packed_e_cached_byte_size_);
  sVar5 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_packed_unexpected_e_,1,
                     &(this->field_0)._impl_._repeated_packed_unexpected_e_cached_byte_size_);
  sVar5 = sVar5 + sVar4 + sVar3;
  if (((undefined1  [88])((undefined1  [88])this->field_0 & (undefined1  [88])0x1) !=
       (undefined1  [88])0x0) && (uVar6 = (ulong)(this->field_0)._impl_.e_, uVar6 != 0)) {
    uVar6 = uVar6 | 1;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar1 = (this->field_0)._impl_._oneof_case_[0];
  if ((uVar1 == 6) || (uVar1 == 5)) {
    uVar6 = (long)(this->field_0)._impl_.o_.oneof_e_1_ | 1;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t MyMessagePlusExtra::ByteSizeLong() const {
  const MyMessagePlusExtra& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_preserve_unknown_enum_unittest.MyMessagePlusExtra)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto3_preserve_unknown_enum_unittest.MyEnumPlusExtra repeated_e = 2;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_e(), 1, this_._impl_._repeated_e_cached_byte_size_);
    }
    // repeated .proto3_preserve_unknown_enum_unittest.MyEnumPlusExtra repeated_packed_e = 3;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_packed_e(), 1, this_._impl_._repeated_packed_e_cached_byte_size_);
    }
    // repeated .proto3_preserve_unknown_enum_unittest.MyEnumPlusExtra repeated_packed_unexpected_e = 4;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_packed_unexpected_e(), 1, this_._impl_._repeated_packed_unexpected_e_cached_byte_size_);
    }
  }
   {
    // .proto3_preserve_unknown_enum_unittest.MyEnumPlusExtra e = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_e() != 0) {
        total_size += 1 +
                      ::_pbi::WireFormatLite::EnumSize(this_._internal_e());
      }
    }
  }
  switch (this_.o_case()) {
    // .proto3_preserve_unknown_enum_unittest.MyEnumPlusExtra oneof_e_1 = 5;
    case kOneofE1: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_e_1());
      break;
    }
    // .proto3_preserve_unknown_enum_unittest.MyEnumPlusExtra oneof_e_2 = 6;
    case kOneofE2: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_e_2());
      break;
    }
    case O_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}